

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.hpp
# Opt level: O1

string_t duckdb::regexp_util::Extract(string_t *input,Vector *result,RE2 *re,StringPiece *rewrite)

{
  string *len;
  ulong uVar1;
  char *pcVar2;
  anon_union_16_2_67f50693_for_value aVar3;
  string extracted;
  string local_78;
  char *local_58;
  size_type sStack_50;
  char local_48 [16];
  StringPiece local_38;
  
  len = &local_78;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  uVar1 = (ulong)(input->value).pointer.length;
  if (uVar1 < 0xd) {
    pcVar2 = (input->value).pointer.prefix;
  }
  else {
    pcVar2 = (input->value).pointer.ptr;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58 = local_48;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,pcVar2 + uVar1);
  local_38.data_ = local_58;
  local_38.size_ = sStack_50;
  duckdb_re2::RE2::Extract(&local_38,re,rewrite,&local_78);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  aVar3.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddString
                 ((StringVector *)result,(Vector *)local_78._M_dataplus._M_p,
                  (char *)local_78._M_string_length,(idx_t)len);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar3.pointer;
}

Assistant:

inline string_t Extract(const string_t &input, Vector &result, const RE2 &re, const duckdb_re2::StringPiece &rewrite) {
	string extracted;
	RE2::Extract(input.GetString(), re, rewrite, &extracted);
	return StringVector::AddString(result, extracted.c_str(), extracted.size());
}